

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O1

void __thiscall crnlib::ktx_texture::clear(ktx_texture *this)

{
  vector<unsigned_char> *pvVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  (this->m_header).m_numberOfArrayElements = 0;
  (this->m_header).m_numberOfFaces = 0;
  (this->m_header).m_numberOfMipmapLevels = 0;
  (this->m_header).m_bytesOfKeyValueData = 0;
  (this->m_header).m_glBaseInternalFormat = 0;
  (this->m_header).m_pixelWidth = 0;
  (this->m_header).m_pixelHeight = 0;
  (this->m_header).m_pixelDepth = 0;
  (this->m_header).m_glType = 0;
  (this->m_header).m_glTypeSize = 0;
  (this->m_header).m_glFormat = 0;
  (this->m_header).m_glInternalFormat = 0;
  (this->m_header).m_identifier[0] = '\0';
  (this->m_header).m_identifier[1] = '\0';
  (this->m_header).m_identifier[2] = '\0';
  (this->m_header).m_identifier[3] = '\0';
  (this->m_header).m_identifier[4] = '\0';
  (this->m_header).m_identifier[5] = '\0';
  (this->m_header).m_identifier[6] = '\0';
  (this->m_header).m_identifier[7] = '\0';
  *(undefined8 *)((this->m_header).m_identifier + 8) = 0;
  pvVar1 = (this->m_key_values).m_p;
  if (pvVar1 != (vector<unsigned_char> *)0x0) {
    uVar4 = (ulong)(this->m_key_values).m_size;
    if (uVar4 != 0) {
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pvVar1->m_p + lVar3);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar4 << 4 != lVar3);
    }
    crnlib_free((this->m_key_values).m_p);
    (this->m_key_values).m_p = (vector<unsigned_char> *)0x0;
    (this->m_key_values).m_size = 0;
    (this->m_key_values).m_capacity = 0;
  }
  pvVar1 = (this->m_image_data).m_p;
  if (pvVar1 != (vector<unsigned_char> *)0x0) {
    uVar4 = (ulong)(this->m_image_data).m_size;
    if (uVar4 != 0) {
      lVar3 = 0;
      do {
        pvVar2 = *(void **)((long)&pvVar1->m_p + lVar3);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar4 << 4 != lVar3);
    }
    crnlib_free((this->m_image_data).m_p);
    (this->m_image_data).m_p = (vector<unsigned_char> *)0x0;
    (this->m_image_data).m_size = 0;
    (this->m_image_data).m_capacity = 0;
  }
  this->m_opposite_endianness = false;
  this->m_block_dim = 0;
  this->m_bytes_per_block = 0;
  return;
}

Assistant:

void clear() {
    m_header.clear();
    m_key_values.clear();
    m_image_data.clear();

    m_block_dim = 0;
    m_bytes_per_block = 0;

    m_opposite_endianness = false;
  }